

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twentytwenty.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  char *__s;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  istream *piVar7;
  pointer piVar8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  pointer __p;
  pointer piVar9;
  pointer piVar10;
  size_t extraout_RDX;
  size_t sVar11;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  int *i;
  pointer __str;
  pointer this;
  pointer piVar12;
  int iVar13;
  int iVar14;
  ij iVar15;
  ij iVar16;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var17;
  pointer piVar18;
  int *i_1;
  pointer piVar19;
  ulong uVar20;
  int k;
  pointer local_2c8;
  pointer local_2c0;
  int j;
  undefined4 uStack_2b4;
  pointer piStack_2b0;
  pointer local_2a8;
  vector<ij,_std::allocator<ij>_> local_298;
  int local_280;
  int local_27c;
  vector<int,_std::allocator<int>_> input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  ifstream file;
  int aiStack_218 [122];
  
  if (argc == 2) {
    __s = argv[1];
    sVar5 = strlen(__s);
    std::ifstream::ifstream(&file,__s,_S_in);
    if (*(int *)((long)aiStack_218 + *(long *)(_file + -0x18)) == 0) {
      tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)&input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_1_ = 0;
      while (piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&file,(string *)&input),
            ((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&tokens,(value_type *)&input);
      }
      std::__cxx11::string::~string((string *)&input);
      std::vector<int,_std::allocator<int>_>::vector
                (&input,(long)tokens.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)tokens.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5,
                 (allocator_type *)&local_298);
      pbVar2 = tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      piVar18 = input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      for (__str = tokens.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __str != pbVar2; __str = __str + 1) {
        iVar4 = std::__cxx11::stoi(__str,(size_t *)0x0,10);
        *piVar18 = iVar4;
        piVar18 = piVar18 + 1;
      }
      std::ranges::__sort_fn::
      operator()<std::vector<int,_std::allocator<int>_>_&,_std::ranges::less,_std::identity>
                ((__sort_fn *)&std::ranges::sort,&input);
      local_298.super__Vector_base<ij,_std::allocator<ij>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_298.super__Vector_base<ij,_std::allocator<ij>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      local_298.super__Vector_base<ij,_std::allocator<ij>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      piVar19 = (pointer)0x0;
      this = (pointer)0x0;
      for (_Var17._M_current =
                input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar8 = this,
          _Var17._M_current <
          input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish; _Var17._M_current = _Var17._M_current + 1) {
        _j = (pointer)CONCAT44(uStack_2b4,-(*_Var17._M_current + -0x7e4));
        if ((*_Var17._M_current < 0x7e5) &&
           (bVar3 = std::
                    binary_search<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                              (_Var17,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                       )input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish,&j), bVar3)) {
          uVar1 = *_Var17._M_current;
          sVar11 = (size_t)uVar1;
          iVar4 = j;
          if (piVar19 ==
              local_298.super__Vector_base<ij,_std::allocator<ij>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            sVar5 = (long)piVar19 - (long)this;
            if (sVar5 == 0x7ffffffffffffff8) {
              local_298.super__Vector_base<ij,_std::allocator<ij>_>._M_impl.super__Vector_impl_data.
              _M_start = this;
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            piVar12 = (pointer)((long)sVar5 >> 3);
            piVar9 = (pointer)0x1;
            if (piVar19 != this) {
              piVar9 = piVar12;
            }
            local_2c8 = (pointer)((long)&piVar12->i + (long)&piVar9->i);
            if ((pointer)0xffffffffffffffe < local_2c8) {
              local_2c8 = (pointer)0xfffffffffffffff;
            }
            if (CARRY8((ulong)piVar9,(ulong)piVar12)) {
              local_2c8 = (pointer)0xfffffffffffffff;
            }
            if (local_2c8 == (pointer)0x0) {
              piVar8 = (pointer)0x0;
            }
            else {
              local_2c0 = piVar12;
              piVar8 = (pointer)operator_new((long)local_2c8 * 8);
              piVar12 = local_2c0;
            }
            iVar16.j = iVar4;
            iVar16.i = uVar1;
            piVar8[(long)piVar12] = iVar16;
            if (0 < (long)sVar5) {
              memmove(piVar8,this,sVar5);
              sVar11 = extraout_RDX;
            }
            piVar19 = (pointer)((long)piVar8 + sVar5 + 8);
            std::_Vector_base<ij,_std::allocator<ij>_>::_M_deallocate
                      ((_Vector_base<ij,_std::allocator<ij>_> *)this,(pointer)piVar12,sVar11);
            local_298.super__Vector_base<ij,_std::allocator<ij>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = piVar8 + (long)local_2c8;
            this = piVar8;
            local_298.super__Vector_base<ij,_std::allocator<ij>_>._M_impl.super__Vector_impl_data.
            _M_finish = piVar19;
          }
          else {
            iVar15.j = j;
            iVar15.i = uVar1;
            *piVar19 = iVar15;
            piVar19 = piVar19 + 1;
            local_298.super__Vector_base<ij,_std::allocator<ij>_>._M_impl.super__Vector_impl_data.
            _M_finish = piVar19;
          }
        }
      }
      for (; local_298.super__Vector_base<ij,_std::allocator<ij>_>._M_impl.super__Vector_impl_data.
             _M_start = piVar8, this != piVar19; this = this + 1) {
        poVar6 = std::operator<<((ostream *)&std::cout,"i: ");
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (poVar6,*(int *)&(((_Vector_impl *)&this->i)->super__Vector_impl_data).
                                            _M_start);
        poVar6 = std::operator<<(poVar6,", j: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->j);
        poVar6 = std::operator<<(poVar6,", i*j: ");
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (poVar6,this->j * *(int *)&(((_Vector_impl *)&this->i)->
                                                      super__Vector_impl_data)._M_start);
        std::endl<char,std::char_traits<char>>(poVar6);
        piVar8 = local_298.super__Vector_base<ij,_std::allocator<ij>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      _j = (pointer)0x0;
      piStack_2b0 = (pointer)0x0;
      local_2a8 = (pointer)0x0;
      piVar12 = (pointer)0x0;
      piVar9 = (pointer)0x0;
      for (piVar18 = input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; piVar10 = _j,
          piVar18 < input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish; piVar18 = piVar18 + 1) {
        k = 0x7e4 - *piVar18;
        local_2c8 = piVar9;
        __last = std::
                 __upper_bound<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int,__gnu_cxx::__ops::_Val_less_iter>
                           (piVar18,input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,&k);
        for (_Var17._M_current = piVar18; _Var17._M_current < __last._M_current;
            _Var17._M_current = _Var17._M_current + 1) {
          k = 0x7e4 - (*piVar18 + *_Var17._M_current);
          if ((-1 < k) &&
             (bVar3 = std::
                      binary_search<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                                (_Var17,__last,&k), bVar3)) {
            iVar4 = *piVar18;
            iVar14 = *_Var17._M_current;
            if (piVar12 == local_2c8) {
              sVar5 = (long)local_2c8 - (long)piVar10;
              if (sVar5 == 0x7ffffffffffffff8) {
                _j = piVar10;
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              __p = (pointer)((long)sVar5 / 0xc);
              sVar11 = (long)sVar5 % 0xc;
              piVar9 = __p;
              if (local_2c8 == piVar10) {
                piVar9 = (pointer)0x1;
              }
              uVar20 = (long)&__p->i + (long)&piVar9->i;
              if (0xaaaaaaaaaaaaaa9 < uVar20) {
                uVar20 = 0xaaaaaaaaaaaaaaa;
              }
              if (CARRY8((ulong)piVar9,(ulong)__p)) {
                uVar20 = 0xaaaaaaaaaaaaaaa;
              }
              local_2c0 = piVar10;
              if (uVar20 == 0) {
                piVar10 = (pointer)0x0;
                iVar13 = k;
              }
              else {
                local_2c8 = (pointer)CONCAT44(local_2c8._4_4_,k);
                local_280 = iVar4;
                local_27c = iVar14;
                piVar10 = (pointer)operator_new(uVar20 * 0xc);
                sVar11 = extraout_RDX_00;
                iVar4 = local_280;
                iVar14 = local_27c;
                iVar13 = (int)local_2c8;
              }
              piVar10[(long)__p].i = iVar4;
              piVar10[(long)__p].j = iVar14;
              piVar10[(long)__p].k = iVar13;
              if (0 < (long)sVar5) {
                memmove(piVar10,local_2c0,sVar5);
                sVar11 = extraout_RDX_01;
              }
              piVar12 = (pointer)((long)piVar10 + sVar5 + 0xc);
              std::_Vector_base<ijk,_std::allocator<ijk>_>::_M_deallocate
                        ((_Vector_base<ijk,_std::allocator<ijk>_> *)local_2c0,__p,sVar11);
              local_2c8 = piVar10 + uVar20;
              piStack_2b0 = piVar12;
              local_2a8 = local_2c8;
            }
            else {
              piVar12->i = iVar4;
              piVar12->j = iVar14;
              piVar12->k = k;
              piVar12 = piVar12 + 1;
              piStack_2b0 = piVar12;
            }
          }
        }
        piVar9 = local_2c8;
        _j = piVar10;
      }
      for (; piVar10 != piVar12; piVar10 = piVar10 + 1) {
        poVar6 = std::operator<<((ostream *)&std::cout,"i: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,piVar10->i);
        poVar6 = std::operator<<(poVar6,", ");
        poVar6 = std::operator<<(poVar6,"j: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,piVar10->j);
        poVar6 = std::operator<<(poVar6,", ");
        poVar6 = std::operator<<(poVar6,"k: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,piVar10->k);
        poVar6 = std::operator<<(poVar6,", ");
        poVar6 = std::operator<<(poVar6,"i*j*k: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,piVar10->j * piVar10->i * piVar10->k);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      std::vector<ijk,_std::allocator<ijk>_>::~vector((vector<ijk,_std::allocator<ijk>_> *)&j);
      std::vector<ij,_std::allocator<ij>_>::~vector(&local_298);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&input.super__Vector_base<int,_std::allocator<int>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokens);
      iVar4 = 0;
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"Could not open ");
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar5);
      std::endl<char,std::char_traits<char>>(poVar6);
      iVar4 = 1;
    }
    std::ifstream::~ifstream(&file);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar6 = std::operator<<(poVar6,*argv);
    poVar6 = std::operator<<(poVar6," path-to-input");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  namespace ranges = std::ranges;

  constexpr auto twenty20 = 2020;

  if (argc != 2) {
    std::cout << "usage: " << argv[0] << " path-to-input" << std::endl;
    return 0;
  }

  std::string_view path = argv[1];

  auto file = std::ifstream{path.begin()};

  if (!file.good()) {
    std::cout << "Could not open " << path << std::endl;
    return 1;
  }

  std::vector<std::string> tokens;
  for (std::string line; std::getline(file, line);)
    tokens.push_back(line);

  std::vector<int> input (tokens.size());
  std::ranges::transform(tokens, input.begin(), [](const auto& line){
    return std::stoi(line);
  });

  ranges::sort(input);

  struct ij { int i, j; };
  std::vector<ij> matching_pairs;
  // for all items `i`
  for (auto i = input.cbegin(); i < input.cend(); i++) {
    // determine whether `2020-i` is in the input
    auto j = twenty20 - *i;
    if (j >= 0 && std::binary_search(i, input.cend(), j) )
      matching_pairs.emplace_back(ij{*i,j});
  }

  ranges::for_each(matching_pairs, [](const auto& ij){
    auto& [i, j] = ij;
    std::cout << "i: " << i << ", j: " << j << ", i*j: " << i*j << std::endl;
  });

  struct ijk { int i, j, k; };
  std::vector<ijk> matching_triples;
  // for all items `i`
  for (auto i = input.cbegin(); i < input.cend(); i++) {
    // find the upper bound `ub` s.t. `i+j <= 2020`
    // and for all items `j` in the range `[i,ub]`
    auto ub = std::upper_bound(i, input.cend(), twenty20 - *i);
    for (auto j = i; j < ub; j++) {
      // determine whether 2020-i-j is in the list
      auto k = twenty20 - *i - *j;
      if (k >= 0 && std::binary_search(j, ub, k))
        matching_triples.emplace_back(ijk{*i, *j, k});
    }
  }

  ranges::for_each(matching_triples, [](const auto& ijk){
    auto& [i,j,k] = ijk;
    std::cout <<
              "i: " << i << ", " <<
              "j: " << j << ", " <<
              "k: " << k << ", " <<
              "i*j*k: " << i*j*k << std::endl;
  });

}